

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O0

CURLcode create_conn(Curl_easy *data,connectdata **in_connect,_Bool *async)

{
  CURLcode CVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  char *local_78;
  char *local_70;
  _Bool local_47;
  _Bool local_45;
  _Bool local_44;
  _Bool local_43;
  byte local_42;
  _Bool local_41;
  _Bool tls_upgraded;
  _Bool done;
  _Bool waitpipe;
  _Bool force_reuse;
  _Bool connections_available;
  connectdata *pcStack_40;
  _Bool reuse;
  connectdata *existing;
  connectdata *conn;
  _Bool *p_Stack_28;
  CURLcode result;
  _Bool *async_local;
  connectdata **in_connect_local;
  Curl_easy *data_local;
  
  conn._4_4_ = 0;
  pcStack_40 = (connectdata *)0x0;
  local_42 = 1;
  local_43 = false;
  local_44 = false;
  *async = false;
  *in_connect = (connectdata *)0x0;
  if ((data->state).url == (char *)0x0) {
    conn._4_4_ = CURLE_URL_MALFORMAT;
  }
  else {
    p_Stack_28 = async;
    async_local = (_Bool *)in_connect;
    in_connect_local = (connectdata **)data;
    existing = allocate_conn(data);
    if (existing == (connectdata *)0x0) {
      conn._4_4_ = CURLE_OUT_OF_MEMORY;
    }
    else {
      *(connectdata **)async_local = existing;
      conn._4_4_ = parseurlandfillconn((Curl_easy *)in_connect_local,existing);
      if (conn._4_4_ == CURLE_OK) {
        if (in_connect_local[0x11d] != (connectdata *)0x0) {
          pcVar3 = (*Curl_cstrdup)((char *)in_connect_local[0x11d]);
          existing->sasl_authzid = pcVar3;
          if (existing->sasl_authzid == (char *)0x0) {
            return CURLE_OUT_OF_MEMORY;
          }
        }
        if (in_connect_local[0x117] != (connectdata *)0x0) {
          pcVar3 = (*Curl_cstrdup)((char *)in_connect_local[0x117]);
          existing->oauth_bearer = pcVar3;
          if (existing->oauth_bearer == (char *)0x0) {
            return CURLE_OUT_OF_MEMORY;
          }
        }
        if (in_connect_local[0x118] != (connectdata *)0x0) {
          pcVar3 = (*Curl_cstrdup)((char *)in_connect_local[0x118]);
          existing->unix_domain_socket = pcVar3;
          if (existing->unix_domain_socket == (char *)0x0) {
            return CURLE_OUT_OF_MEMORY;
          }
          existing->bits =
               (ConnectBits)
               ((ulong)existing->bits & 0xfffffffffbffffff |
               (ulong)((ushort)((ulong)*(undefined8 *)((long)in_connect_local + 0xa34) >> 0x30) & 1)
               << 0x1a);
        }
        conn._4_4_ = create_conn_helper_init_proxy((Curl_easy *)in_connect_local,existing);
        if (conn._4_4_ == CURLE_OK) {
          if (((existing->given->flags & 1) != 0) && (((ulong)existing->bits & 1) != 0)) {
            existing->bits = (ConnectBits)((ulong)existing->bits & 0xfffffffffffffff7 | 8);
          }
          conn._4_4_ = parse_remote_port((Curl_easy *)in_connect_local,existing);
          if ((((conn._4_4_ == CURLE_OK) &&
               (conn._4_4_ = override_login((Curl_easy *)in_connect_local,existing),
               conn._4_4_ == CURLE_OK)) &&
              (conn._4_4_ = set_login((Curl_easy *)in_connect_local,existing),
              conn._4_4_ == CURLE_OK)) &&
             (conn._4_4_ = parse_connect_to_slist
                                     ((Curl_easy *)in_connect_local,existing,
                                      (curl_slist *)in_connect_local[0x9b]), conn._4_4_ == CURLE_OK)
             ) {
            if ((((ulong)existing->bits & 1) != 0) &&
               (CVar1 = Curl_idnconvert_hostname(&(existing->http_proxy).host), CVar1 != CURLE_OK))
            {
              return CVar1;
            }
            conn._4_4_ = 0;
            if ((((ulong)existing->bits >> 1 & 1) != 0) &&
               (CVar1 = Curl_idnconvert_hostname(&(existing->socks_proxy).host), CVar1 != CURLE_OK))
            {
              return CVar1;
            }
            conn._4_4_ = 0;
            if ((((ulong)existing->bits >> 8 & 1) != 0) &&
               (CVar1 = Curl_idnconvert_hostname(&existing->conn_to_host), CVar1 != CURLE_OK)) {
              return CVar1;
            }
            conn._4_4_ = 0;
            if ((((ulong)existing->bits >> 8 & 1) != 0) &&
               (iVar2 = curl_strequal((existing->conn_to_host).name,(existing->host).name),
               iVar2 != 0)) {
              existing->bits = (ConnectBits)((ulong)existing->bits & 0xfffffffffffffeff);
            }
            if ((((ulong)existing->bits >> 9 & 1) != 0) &&
               (existing->conn_to_port == existing->remote_port)) {
              existing->bits = (ConnectBits)((ulong)existing->bits & 0xfffffffffffffdff);
            }
            if (((((ulong)existing->bits >> 8 & 1) != 0) || (((ulong)existing->bits >> 9 & 1) != 0))
               && (((ulong)existing->bits & 1) != 0)) {
              existing->bits = (ConnectBits)((ulong)existing->bits & 0xfffffffffffffff7 | 8);
            }
            conn._4_4_ = setup_connection_internals((Curl_easy *)in_connect_local,existing);
            if (conn._4_4_ == CURLE_OK) {
              if ((existing->handler->flags & 0x10) == 0) {
                existing->recv[0] = Curl_cf_recv;
                existing->send[0] = Curl_cf_send;
                existing->recv[1] = Curl_cf_recv;
                existing->send[1] = Curl_cf_send;
                existing->bits =
                     (ConnectBits)
                     ((ulong)existing->bits & 0xffffffffff7fffff |
                     (ulong)((uint)((ulong)*(undefined8 *)((long)in_connect_local + 0xa34) >> 0x29)
                            & 1) << 0x17);
                conn._4_4_ = Curl_ssl_easy_config_complete((Curl_easy *)in_connect_local);
                if (conn._4_4_ == CURLE_OK) {
                  Curl_cpool_prune_dead((Curl_easy *)in_connect_local);
                  if ((((*(ulong *)((long)in_connect_local + 0xa34) >> 0x20 & 1) == 0) ||
                      (in_connect_local[0x18e] != (connectdata *)0x0)) &&
                     ((*(ulong *)((long)in_connect_local + 0xa34) & 1) == 0)) {
                    local_41 = ConnectionExists((Curl_easy *)in_connect_local,existing,
                                                &stack0xffffffffffffffc0,&local_43,&local_44);
                  }
                  else {
                    local_41 = false;
                  }
                  if (local_41 == false) {
                    if (((existing->handler->flags & 0x100) != 0) &&
                       ((*(ulong *)((long)in_connect_local + 0xa34) >> 0x2a & 1) != 0)) {
                      existing->bits =
                           (ConnectBits)((ulong)existing->bits & 0xfffffffffeffffff | 0x1000000);
                    }
                    if ((local_44 & 1U) == 0) {
                      iVar2 = Curl_cpool_check_limits((Curl_easy *)in_connect_local,existing);
                      if (iVar2 == 1) {
                        if (((in_connect_local != (connectdata **)0x0) &&
                            ((*(ulong *)((long)in_connect_local + 0xa34) >> 0x1e & 1) != 0)) &&
                           ((in_connect_local[0x263] == (connectdata *)0x0 ||
                            (0 < *(int *)&(in_connect_local[0x263]->cpool_node)._ptr)))) {
                          Curl_infof((Curl_easy *)in_connect_local,
                                     "No more connections allowed to host");
                        }
                        local_42 = 0;
                      }
                      else if (iVar2 == 2) {
                        if ((long)in_connect_local[0x13f] < 0) {
                          if (((in_connect_local != (connectdata **)0x0) &&
                              ((*(ulong *)((long)in_connect_local + 0xa34) >> 0x1e & 1) != 0)) &&
                             ((in_connect_local[0x263] == (connectdata *)0x0 ||
                              (0 < *(int *)&(in_connect_local[0x263]->cpool_node)._ptr)))) {
                            Curl_infof((Curl_easy *)in_connect_local,
                                       "No connections available, total of %ld reached.",
                                       *(undefined8 *)
                                        &(in_connect_local[0x14]->shutdown).start[1].tv_usec);
                          }
                          local_42 = 0;
                        }
                        else if (((in_connect_local != (connectdata **)0x0) &&
                                 ((*(ulong *)((long)in_connect_local + 0xa34) >> 0x1e & 1) != 0)) &&
                                ((in_connect_local[0x263] == (connectdata *)0x0 ||
                                 (0 < *(int *)&(in_connect_local[0x263]->cpool_node)._ptr)))) {
                          Curl_infof((Curl_easy *)in_connect_local,
                                     "Allowing DoH to override max connection limit");
                        }
                      }
                    }
                    else {
                      if (((in_connect_local != (connectdata **)0x0) &&
                          ((*(ulong *)((long)in_connect_local + 0xa34) >> 0x1e & 1) != 0)) &&
                         ((in_connect_local[0x263] == (connectdata *)0x0 ||
                          (0 < *(int *)&(in_connect_local[0x263]->cpool_node)._ptr)))) {
                        Curl_infof((Curl_easy *)in_connect_local,
                                   "Waiting on connection to negotiate possible multiplexing.");
                      }
                      local_42 = 0;
                    }
                    if ((local_42 & 1) == 0) {
                      Curl_conn_free((Curl_easy *)in_connect_local,existing);
                      async_local[0] = false;
                      async_local[1] = false;
                      async_local[2] = false;
                      async_local[3] = false;
                      async_local[4] = false;
                      async_local[5] = false;
                      async_local[6] = false;
                      async_local[7] = false;
                      return CURLE_NO_CONNECTION_AVAILABLE;
                    }
                    conn._4_4_ = Curl_ssl_conn_config_init((Curl_easy *)in_connect_local,existing);
                    if (conn._4_4_ != CURLE_OK) {
                      return conn._4_4_;
                    }
                    Curl_attach_connection((Curl_easy *)in_connect_local,existing);
                    conn._4_4_ = Curl_cpool_add((Curl_easy *)in_connect_local,existing);
                    if (conn._4_4_ != CURLE_OK) {
                      return conn._4_4_;
                    }
                    if ((((ulong)in_connect_local[0x1a0] & 8) != 0) &&
                       (((ulong)in_connect_local[0x1a2] & 1) != 0)) {
                      if (((in_connect_local != (connectdata **)0x0) &&
                          ((*(ulong *)((long)in_connect_local + 0xa34) >> 0x1e & 1) != 0)) &&
                         ((in_connect_local[0x263] == (connectdata *)0x0 ||
                          (0 < *(int *)&(in_connect_local[0x263]->cpool_node)._ptr)))) {
                        Curl_infof((Curl_easy *)in_connect_local,
                                   "NTLM picked AND auth done set, clear picked");
                      }
                      in_connect_local[0x1a0] = (connectdata *)0x0;
                      *(byte *)(in_connect_local + 0x1a2) =
                           *(byte *)(in_connect_local + 0x1a2) & 0xfe;
                    }
                    if ((((ulong)in_connect_local[0x1a4] & 8) != 0) &&
                       (((ulong)in_connect_local[0x1a6] & 1) != 0)) {
                      if (((in_connect_local != (connectdata **)0x0) &&
                          ((*(ulong *)((long)in_connect_local + 0xa34) >> 0x1e & 1) != 0)) &&
                         ((in_connect_local[0x263] == (connectdata *)0x0 ||
                          (0 < *(int *)&(in_connect_local[0x263]->cpool_node)._ptr)))) {
                        Curl_infof((Curl_easy *)in_connect_local,
                                   "NTLM-proxy picked AND auth done set, clear picked");
                      }
                      in_connect_local[0x1a4] = (connectdata *)0x0;
                      *(byte *)(in_connect_local + 0x1a6) =
                           *(byte *)(in_connect_local + 0x1a6) & 0xfe;
                    }
                  }
                  else {
                    local_47 = false;
                    if ((existing->given->flags & 1) == 0) {
                      local_47 = Curl_conn_is_ssl(existing,0);
                    }
                    reuse_conn((Curl_easy *)in_connect_local,existing,pcStack_40);
                    existing = pcStack_40;
                    *(connectdata **)async_local = pcStack_40;
                    if (((in_connect_local != (connectdata **)0x0) &&
                        ((*(ulong *)((long)in_connect_local + 0xa34) >> 0x1e & 1) != 0)) &&
                       ((in_connect_local[0x263] == (connectdata *)0x0 ||
                        (0 < *(int *)&(in_connect_local[0x263]->cpool_node)._ptr)))) {
                      pcVar3 = "";
                      if (local_47 != false) {
                        pcVar3 = " (upgraded to SSL)";
                      }
                      pcVar4 = "host";
                      if (((ulong)pcStack_40->bits >> 4 & 1) != 0) {
                        pcVar4 = "proxy";
                      }
                      if ((pcStack_40->socks_proxy).host.name == (char *)0x0) {
                        if ((pcStack_40->http_proxy).host.name == (char *)0x0) {
                          local_78 = (pcStack_40->host).dispname;
                        }
                        else {
                          local_78 = (pcStack_40->http_proxy).host.dispname;
                        }
                        local_70 = local_78;
                      }
                      else {
                        local_70 = (pcStack_40->socks_proxy).host.dispname;
                      }
                      Curl_infof((Curl_easy *)in_connect_local,
                                 "Re-using existing %s: connection%s with %s %s",
                                 pcStack_40->given->scheme,pcVar3,pcVar4,local_70);
                    }
                  }
                  Curl_init_do((Curl_easy *)in_connect_local,existing);
                  conn._4_4_ = setup_range((Curl_easy *)in_connect_local);
                  if (conn._4_4_ == CURLE_OK) {
                    if (((ulong)existing->bits >> 6 & 1) == 0) {
                      CVar1 = resolve_server((Curl_easy *)in_connect_local,existing,p_Stack_28);
                      if (CVar1 != CURLE_OK) {
                        return CVar1;
                      }
                    }
                    else {
                      *p_Stack_28 = false;
                    }
                    conn._4_4_ = 0;
                    in_connect_local[0x295] = (connectdata *)existing->handler->scheme;
                    *(curl_prot_t *)(in_connect_local + 0x296) =
                         existing->handler->protocol & 0x3ffffff;
                    *(byte *)((long)in_connect_local + 0x14cc) =
                         *(byte *)((long)in_connect_local + 0x14cc) & 0xfd |
                         ((byte)((ulong)existing->bits >> 4) & 1) << 1;
                    conn._4_4_ = Curl_conn_ev_data_setup((Curl_easy *)in_connect_local);
                  }
                }
              }
              else {
                in_connect_local[0x295] = (connectdata *)existing->handler->scheme;
                *(curl_prot_t *)(in_connect_local + 0x296) = existing->handler->protocol & 0x3ffffff
                ;
                conn._4_4_ = (*existing->handler->connect_it)
                                       ((Curl_easy *)in_connect_local,&local_45);
                if (conn._4_4_ == CURLE_OK) {
                  Curl_attach_connection((Curl_easy *)in_connect_local,existing);
                  conn._4_4_ = Curl_cpool_add((Curl_easy *)in_connect_local,existing);
                  if (conn._4_4_ == CURLE_OK) {
                    conn._4_4_ = setup_range((Curl_easy *)in_connect_local);
                  }
                  if (conn._4_4_ != CURLE_OK) {
                    (*existing->handler->done)((Curl_easy *)in_connect_local,conn._4_4_,false);
                    return conn._4_4_;
                  }
                  Curl_xfer_setup_nop((Curl_easy *)in_connect_local);
                }
                Curl_init_do((Curl_easy *)in_connect_local,existing);
              }
            }
          }
        }
      }
    }
  }
  return conn._4_4_;
}

Assistant:

static CURLcode create_conn(struct Curl_easy *data,
                            struct connectdata **in_connect,
                            bool *async)
{
  CURLcode result = CURLE_OK;
  struct connectdata *conn;
  struct connectdata *existing = NULL;
  bool reuse;
  bool connections_available = TRUE;
  bool force_reuse = FALSE;
  bool waitpipe = FALSE;

  *async = FALSE;
  *in_connect = NULL;

  /*************************************************************
   * Check input data
   *************************************************************/
  if(!data->state.url) {
    result = CURLE_URL_MALFORMAT;
    goto out;
  }

  /* First, split up the current URL in parts so that we can use the
     parts for checking against the already present connections. In order
     to not have to modify everything at once, we allocate a temporary
     connection data struct and fill in for comparison purposes. */
  conn = allocate_conn(data);

  if(!conn) {
    result = CURLE_OUT_OF_MEMORY;
    goto out;
  }

  /* We must set the return variable as soon as possible, so that our
     parent can cleanup any possible allocs we may have done before
     any failure */
  *in_connect = conn;

  /* Do the unfailable inits first, before checks that may early return */
  /* GSSAPI related inits */
  Curl_sec_conn_init(conn);

  result = parseurlandfillconn(data, conn);
  if(result)
    goto out;

  if(data->set.str[STRING_SASL_AUTHZID]) {
    conn->sasl_authzid = strdup(data->set.str[STRING_SASL_AUTHZID]);
    if(!conn->sasl_authzid) {
      result = CURLE_OUT_OF_MEMORY;
      goto out;
    }
  }

  if(data->set.str[STRING_BEARER]) {
    conn->oauth_bearer = strdup(data->set.str[STRING_BEARER]);
    if(!conn->oauth_bearer) {
      result = CURLE_OUT_OF_MEMORY;
      goto out;
    }
  }

#ifdef USE_UNIX_SOCKETS
  if(data->set.str[STRING_UNIX_SOCKET_PATH]) {
    conn->unix_domain_socket = strdup(data->set.str[STRING_UNIX_SOCKET_PATH]);
    if(!conn->unix_domain_socket) {
      result = CURLE_OUT_OF_MEMORY;
      goto out;
    }
    conn->bits.abstract_unix_socket = data->set.abstract_unix_socket;
  }
#endif

  /* After the Unix socket init but before the proxy vars are used, parse and
     initialize the proxy vars */
#ifndef CURL_DISABLE_PROXY
  result = create_conn_helper_init_proxy(data, conn);
  if(result)
    goto out;

  /*************************************************************
   * If the protocol is using SSL and HTTP proxy is used, we set
   * the tunnel_proxy bit.
   *************************************************************/
  if((conn->given->flags&PROTOPT_SSL) && conn->bits.httpproxy)
    conn->bits.tunnel_proxy = TRUE;
#endif

  /*************************************************************
   * Figure out the remote port number and fix it in the URL
   *************************************************************/
  result = parse_remote_port(data, conn);
  if(result)
    goto out;

  /* Check for overridden login details and set them accordingly so that
     they are known when protocol->setup_connection is called! */
  result = override_login(data, conn);
  if(result)
    goto out;

  result = set_login(data, conn); /* default credentials */
  if(result)
    goto out;

  /*************************************************************
   * Process the "connect to" linked list of hostname/port mappings.
   * Do this after the remote port number has been fixed in the URL.
   *************************************************************/
  result = parse_connect_to_slist(data, conn, data->set.connect_to);
  if(result)
    goto out;

  /*************************************************************
   * IDN-convert the proxy hostnames
   *************************************************************/
#ifndef CURL_DISABLE_PROXY
  if(conn->bits.httpproxy) {
    result = Curl_idnconvert_hostname(&conn->http_proxy.host);
    if(result)
      return result;
  }
  if(conn->bits.socksproxy) {
    result = Curl_idnconvert_hostname(&conn->socks_proxy.host);
    if(result)
      return result;
  }
#endif
  if(conn->bits.conn_to_host) {
    result = Curl_idnconvert_hostname(&conn->conn_to_host);
    if(result)
      return result;
  }

  /*************************************************************
   * Check whether the host and the "connect to host" are equal.
   * Do this after the hostnames have been IDN-converted.
   *************************************************************/
  if(conn->bits.conn_to_host &&
     strcasecompare(conn->conn_to_host.name, conn->host.name)) {
    conn->bits.conn_to_host = FALSE;
  }

  /*************************************************************
   * Check whether the port and the "connect to port" are equal.
   * Do this after the remote port number has been fixed in the URL.
   *************************************************************/
  if(conn->bits.conn_to_port && conn->conn_to_port == conn->remote_port) {
    conn->bits.conn_to_port = FALSE;
  }

#ifndef CURL_DISABLE_PROXY
  /*************************************************************
   * If the "connect to" feature is used with an HTTP proxy,
   * we set the tunnel_proxy bit.
   *************************************************************/
  if((conn->bits.conn_to_host || conn->bits.conn_to_port) &&
      conn->bits.httpproxy)
    conn->bits.tunnel_proxy = TRUE;
#endif

  /*************************************************************
   * Setup internals depending on protocol. Needs to be done after
   * we figured out what/if proxy to use.
   *************************************************************/
  result = setup_connection_internals(data, conn);
  if(result)
    goto out;

  /***********************************************************************
   * file: is a special case in that it does not need a network connection
   ***********************************************************************/
#ifndef CURL_DISABLE_FILE
  if(conn->handler->flags & PROTOPT_NONETWORK) {
    bool done;
    /* this is supposed to be the connect function so we better at least check
       that the file is present here! */
    DEBUGASSERT(conn->handler->connect_it);
    data->info.conn_scheme = conn->handler->scheme;
    /* conn_protocol can only provide "old" protocols */
    data->info.conn_protocol = (conn->handler->protocol) & CURLPROTO_MASK;
    result = conn->handler->connect_it(data, &done);

    /* Setup a "faked" transfer that will do nothing */
    if(!result) {
      Curl_attach_connection(data, conn);
      result = Curl_cpool_add(data, conn);
      if(!result) {
        /* Setup whatever necessary for a resumed transfer */
        result = setup_range(data);
      }

      if(result) {
        DEBUGASSERT(conn->handler->done);
        /* we ignore the return code for the protocol-specific DONE */
        (void)conn->handler->done(data, result, FALSE);
        goto out;
      }
      Curl_xfer_setup_nop(data);
    }

    /* since we skip do_init() */
    Curl_init_do(data, conn);

    goto out;
  }
#endif

  /* Setup filter for network connections */
  conn->recv[FIRSTSOCKET] = Curl_cf_recv;
  conn->send[FIRSTSOCKET] = Curl_cf_send;
  conn->recv[SECONDARYSOCKET] = Curl_cf_recv;
  conn->send[SECONDARYSOCKET] = Curl_cf_send;
  conn->bits.tcp_fastopen = data->set.tcp_fastopen;

  /* Complete the easy's SSL configuration for connection cache matching */
  result = Curl_ssl_easy_config_complete(data);
  if(result)
    goto out;

  Curl_cpool_prune_dead(data);

  /*************************************************************
   * Check the current list of connections to see if we can
   * reuse an already existing one or if we have to create a
   * new one.
   *************************************************************/

  DEBUGASSERT(conn->user);
  DEBUGASSERT(conn->passwd);

  /* reuse_fresh is TRUE if we are told to use a new connection by force, but
     we only acknowledge this option if this is not a reused connection
     already (which happens due to follow-location or during an HTTP
     authentication phase). CONNECT_ONLY transfers also refuse reuse. */
  if((data->set.reuse_fresh && !data->state.followlocation) ||
     data->set.connect_only)
    reuse = FALSE;
  else
    reuse = ConnectionExists(data, conn, &existing, &force_reuse, &waitpipe);

  if(reuse) {
    /*
     * We already have a connection for this, we got the former connection in
     * `existing` and thus we need to cleanup the one we just
     * allocated before we can move along and use `existing`.
     */
    bool tls_upgraded = (!(conn->given->flags & PROTOPT_SSL) &&
                         Curl_conn_is_ssl(conn, FIRSTSOCKET));

    reuse_conn(data, conn, existing);
    conn = existing;
    *in_connect = conn;

#ifndef CURL_DISABLE_PROXY
    infof(data, "Re-using existing %s: connection%s with %s %s",
          conn->given->scheme,
          tls_upgraded ? " (upgraded to SSL)" : "",
          conn->bits.proxy ? "proxy" : "host",
          conn->socks_proxy.host.name ? conn->socks_proxy.host.dispname :
          conn->http_proxy.host.name ? conn->http_proxy.host.dispname :
          conn->host.dispname);
#else
    infof(data, "Re-using existing %s: connection%s with host %s",
          conn->given->scheme,
          tls_upgraded ? " (upgraded to SSL)" : "",
          conn->host.dispname);
#endif
  }
  else {
    /* We have decided that we want a new connection. However, we may not
       be able to do that if we have reached the limit of how many
       connections we are allowed to open. */

    if(conn->handler->flags & PROTOPT_ALPN) {
      /* The protocol wants it, so set the bits if enabled in the easy handle
         (default) */
      if(data->set.ssl_enable_alpn)
        conn->bits.tls_enable_alpn = TRUE;
    }

    if(waitpipe) {
      /* There is a connection that *might* become usable for multiplexing
         "soon", and we wait for that */
      infof(data, "Waiting on connection to negotiate possible multiplexing.");
      connections_available = FALSE;
    }
    else {
      switch(Curl_cpool_check_limits(data, conn)) {
      case CPOOL_LIMIT_DEST:
        infof(data, "No more connections allowed to host");
        connections_available = FALSE;
        break;
      case CPOOL_LIMIT_TOTAL:
#ifndef CURL_DISABLE_DOH
        if(data->set.dohfor_mid >= 0)
          infof(data, "Allowing DoH to override max connection limit");
        else
#endif
        {
          infof(data, "No connections available, total of %ld reached.",
                data->multi->max_total_connections);
          connections_available = FALSE;
        }
        break;
      default:
        break;
      }
    }

    if(!connections_available) {
      Curl_conn_free(data, conn);
      *in_connect = NULL;

      result = CURLE_NO_CONNECTION_AVAILABLE;
      goto out;
    }
    else {
      /*
       * This is a brand new connection, so let's store it in the connection
       * cache of ours!
       */
      result = Curl_ssl_conn_config_init(data, conn);
      if(result) {
        DEBUGF(fprintf(stderr, "Error: init connection ssl config\n"));
        goto out;
      }

      Curl_attach_connection(data, conn);
      result = Curl_cpool_add(data, conn);
      if(result)
        goto out;
    }

#ifdef USE_NTLM
    /* If NTLM is requested in a part of this connection, make sure we do not
       assume the state is fine as this is a fresh connection and NTLM is
       connection based. */
    if((data->state.authhost.picked & CURLAUTH_NTLM) &&
       data->state.authhost.done) {
      infof(data, "NTLM picked AND auth done set, clear picked");
      data->state.authhost.picked = CURLAUTH_NONE;
      data->state.authhost.done = FALSE;
    }

    if((data->state.authproxy.picked & CURLAUTH_NTLM) &&
       data->state.authproxy.done) {
      infof(data, "NTLM-proxy picked AND auth done set, clear picked");
      data->state.authproxy.picked = CURLAUTH_NONE;
      data->state.authproxy.done = FALSE;
    }
#endif
  }

  /* Setup and init stuff before DO starts, in preparing for the transfer. */
  Curl_init_do(data, conn);

  /*
   * Setup whatever necessary for a resumed transfer
   */
  result = setup_range(data);
  if(result)
    goto out;

  /* Continue connectdata initialization here. */

  if(conn->bits.reuse) {
    /* We are reusing the connection - no need to resolve anything, and
       idnconvert_hostname() was called already in create_conn() for the reuse
       case. */
    *async = FALSE;
  }
  else {
    /*************************************************************
     * Resolve the address of the server or proxy
     *************************************************************/
    result = resolve_server(data, conn, async);
    if(result)
      goto out;
  }

  /* persist the scheme and handler the transfer is using */
  data->info.conn_scheme = conn->handler->scheme;
  /* conn_protocol can only provide "old" protocols */
  data->info.conn_protocol = (conn->handler->protocol) & CURLPROTO_MASK;
  data->info.used_proxy =
#ifdef CURL_DISABLE_PROXY
    0
#else
    conn->bits.proxy
#endif
    ;

  /* Everything general done, inform filters that they need
   * to prepare for a data transfer. */
  result = Curl_conn_ev_data_setup(data);

out:
  return result;
}